

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Recursion(void)

{
  int bytes;
  
  TestRecursion(0x3c00,".");
  TestRecursion(0x3c00,"a");
  TestRecursion(0x3c00,"a.");
  TestRecursion(0x3c00,"ab.");
  TestRecursion(0x3c00,"abc.");
  return;
}

Assistant:

TEST(RE2, Recursion) {
  // Test that recursion is stopped.
  // This test is PCRE-legacy -- there's no recursion in RE2.
  int bytes = 15 * 1024;  // enough to crash PCRE
  TestRecursion(bytes, ".");
  TestRecursion(bytes, "a");
  TestRecursion(bytes, "a.");
  TestRecursion(bytes, "ab.");
  TestRecursion(bytes, "abc.");
}